

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Try.h
# Opt level: O0

Try<void> * __thiscall async_simple::Try<void>::operator=(Try<void> *this,Try<void> *other)

{
  exception_ptr *in_RSI;
  exception_ptr *in_RDI;
  
  if (in_RDI != in_RSI) {
    std::swap<std::__exception_ptr::exception_ptr>(in_RSI,in_RDI);
  }
  return (Try<void> *)in_RDI;
}

Assistant:

Try& operator=(Try&& other) {
        if (this != &other) {
            std::swap(_error, other._error);
        }
        return *this;
    }